

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Bool FindLastLI(Node *list,Node **lastli)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  *lastli = (Node *)0x0;
  pNVar2 = (Node *)0x0;
  ppNVar3 = &list->content;
  while (pNVar1 = *ppNVar3, pNVar1 != (Node *)0x0) {
    if (((pNVar1->tag != (Dict *)0x0) && (pNVar1->tag->id == TidyTag_LI)) &&
       (pNVar1->type == StartTag)) {
      *lastli = pNVar1;
      pNVar2 = pNVar1;
    }
    ppNVar3 = &pNVar1->next;
  }
  return (Bool)(pNVar2 != (Node *)0x0);
}

Assistant:

static Bool FindLastLI( Node *list, Node **lastli )
{
    Node *node;

    *lastli = NULL;
    for ( node = list->content; node ; node = node->next )
        if ( nodeIsLI(node) && node->type == StartTag )
            *lastli=node;
    return *lastli ? yes:no;
}